

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::SoftPrintPolicyDomainElement_abi_cxx11_(PlanningUnitMADPDiscrete *this)

{
  PolicyDomainCategory in_stack_0000000c;
  Index in_stack_00000010;
  Index in_stack_00000014;
  PlanningUnitMADPDiscrete *in_stack_00000018;
  
  SoftPrintPolicyDomainElement_abi_cxx11_
            (in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c);
  return;
}

Assistant:

string PlanningUnitMADPDiscrete::SoftPrintPolicyDomainElement(
    Index agentI, Index dI, PolicyGlobals::PolicyDomainCategory cat ) const
{
    switch ( cat )
    {
    case PolicyGlobals::OHIST_INDEX :
        {
            string s = SoftPrintObservationHistory(agentI, dI);
            return s;


            break;
        }
    case PolicyGlobals::AOHIST_INDEX :
        return GetActionObservationHistoryTree(agentI,dI)->
            GetActionObservationHistory()->SoftPrint();
        break;
    case PolicyGlobals::TYPE_INDEX : 
        throw(E("SoftPrintPolicyDomain: types are not a valid policy domain for a PlanningUnitMADPDiscrete"));
        break;
    default:
        throw(E("SoftPrintPolicyDomain: incorrect JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory"));
        break;
    }
    return("IMPOSSIBLE!");
}